

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cc
# Opt level: O2

void __thiscall ConfigFile::ConfigFile(ConfigFile *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_ConfigFile = (_func_int **)&PTR__ConfigFile_00152ad8;
  p_Var1 = &(this->data)._M_t._M_impl.super__Rb_tree_header;
  (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->data)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

ConfigFile::ConfigFile() {
}